

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader.cpp
# Opt level: O0

bool __thiscall
BamTools::BamReader::SetRegion
          (BamReader *this,int *leftRefID,int *leftBound,int *rightRefID,int *rightBound)

{
  bool bVar1;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  int *in_R8;
  BamRegion *in_stack_00000080;
  BamReaderPrivate *in_stack_00000088;
  BamRegion local_38 [3];
  
  BamRegion::BamRegion(local_38,in_RSI,in_RDX,in_RCX,in_R8);
  bVar1 = Internal::BamReaderPrivate::SetRegion(in_stack_00000088,in_stack_00000080);
  return bVar1;
}

Assistant:

bool BamReader::SetRegion(const int& leftRefID, const int& leftBound, const int& rightRefID,
                          const int& rightBound)
{
    return d->SetRegion(BamRegion(leftRefID, leftBound, rightRefID, rightBound));
}